

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O2

void ImGui::TableUpdateColumnsWeightFromWidth(ImGuiTable *table)

{
  float fVar1;
  int iVar2;
  ImGuiTableColumn *pIVar3;
  int iVar4;
  float local_20;
  float local_1c;
  
  if ((table->LeftMostStretchedColumn == -1) || (table->RightMostStretchedColumn == -1)) {
    __assert_fail("table->LeftMostStretchedColumn != -1 && table->RightMostStretchedColumn != -1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui_tables.cpp"
                  ,0x832,"void ImGui::TableUpdateColumnsWeightFromWidth(ImGuiTable *)");
  }
  local_20 = 0.0;
  local_1c = 0.0;
  for (iVar4 = 0; iVar2 = table->ColumnsCount, iVar4 < iVar2; iVar4 = iVar4 + 1) {
    pIVar3 = ImSpan<ImGuiTableColumn>::operator[](&table->Columns,iVar4);
    if ((pIVar3->IsEnabled == true) && ((pIVar3->Flags & 4) != 0)) {
      if (pIVar3->StretchWeight <= 0.0) {
        __assert_fail("column->StretchWeight > 0.0f",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui_tables.cpp"
                      ,0x83c,"void ImGui::TableUpdateColumnsWeightFromWidth(ImGuiTable *)");
      }
      local_1c = local_1c + pIVar3->StretchWeight;
      local_20 = local_20 + pIVar3->WidthRequest;
    }
  }
  if ((0.0 < local_1c) && (0.0 < local_20)) {
    iVar4 = 0;
    while( true ) {
      if (iVar2 <= iVar4) {
        return;
      }
      pIVar3 = ImSpan<ImGuiTableColumn>::operator[](&table->Columns,iVar4);
      if (((pIVar3->IsEnabled == true) && ((pIVar3->Flags & 4) != 0)) &&
         (fVar1 = (pIVar3->WidthRequest / local_20) * local_1c, pIVar3->StretchWeight = fVar1,
         fVar1 <= 0.0)) break;
      iVar4 = iVar4 + 1;
      iVar2 = table->ColumnsCount;
    }
    __assert_fail("column->StretchWeight > 0.0f",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui_tables.cpp"
                  ,0x849,"void ImGui::TableUpdateColumnsWeightFromWidth(ImGuiTable *)");
  }
  __assert_fail("visible_weight > 0.0f && visible_width > 0.0f",
                "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui_tables.cpp"
                ,0x840,"void ImGui::TableUpdateColumnsWeightFromWidth(ImGuiTable *)");
}

Assistant:

void ImGui::TableUpdateColumnsWeightFromWidth(ImGuiTable* table)
{
    IM_ASSERT(table->LeftMostStretchedColumn != -1 && table->RightMostStretchedColumn != -1);

    // Measure existing quantity
    float visible_weight = 0.0f;
    float visible_width = 0.0f;
    for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
    {
        ImGuiTableColumn* column = &table->Columns[column_n];
        if (!column->IsEnabled || !(column->Flags & ImGuiTableColumnFlags_WidthStretch))
            continue;
        IM_ASSERT(column->StretchWeight > 0.0f);
        visible_weight += column->StretchWeight;
        visible_width += column->WidthRequest;
    }
    IM_ASSERT(visible_weight > 0.0f && visible_width > 0.0f);

    // Apply new weights
    for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
    {
        ImGuiTableColumn* column = &table->Columns[column_n];
        if (!column->IsEnabled || !(column->Flags & ImGuiTableColumnFlags_WidthStretch))
            continue;
        column->StretchWeight = (column->WidthRequest / visible_width) * visible_weight;
        IM_ASSERT(column->StretchWeight > 0.0f);
    }
}